

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall
helics::Input::Input
          (Input *this,ValueFederate *valueFed,string_view key,string_view defaultType,
          string_view units)

{
  string_view name;
  string_view type;
  string_view name_00;
  string_view units_00;
  bool bVar1;
  Input *pIVar2;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  char *in_R9;
  Input *in_stack_00000008;
  Input *in_stack_00000010;
  Input *inp;
  Input *in_stack_ffffffffffffff08;
  Input *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  ValueFederate *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  ValueFederate *in_stack_ffffffffffffffb0;
  
  Interface::Interface(&in_stack_ffffffffffffff10->super_Interface);
  *in_RDI = &PTR__Input_00a46e48;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 10) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x54) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  *(undefined1 *)((long)in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x5b) = 0;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined2 *)((long)in_RDI + 0x5e) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = 0;
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::variant<double_const&,void,void,double,void>
            ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)in_stack_ffffffffffffff10,(double *)in_stack_ffffffffffffff08);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x3c0172);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x3c0188);
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::vector((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
            *)0x3c019e);
  std::__cxx11::string::string(in_stack_ffffffffffffff20);
  in_RDI[0x1f] = 0xbff0000000000000;
  in_RDI[0x20] = 0;
  std::
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  ::variant((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
             *)0x3c01e6);
  name._M_str = in_stack_ffffffffffffff98;
  name._M_len = in_stack_ffffffffffffff90;
  pIVar2 = helics::ValueFederate::getInput(in_stack_ffffffffffffff88,name);
  bVar1 = Interface::isValid((Interface *)0x3c0234);
  if (bVar1) {
    operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    name_00._M_str = in_RSI;
    name_00._M_len = (size_t)pIVar2;
    type._M_str = in_RCX;
    type._M_len = in_RDX;
    units_00._M_str = in_R9;
    units_00._M_len = in_R8;
    helics::ValueFederate::registerInput(in_stack_ffffffffffffffb0,name_00,type,units_00);
    operator=(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

Input::Input(ValueFederate* valueFed,
             std::string_view key,
             std::string_view defaultType,
             std::string_view units)
{
    auto& inp = valueFed->getInput(key);
    if (inp.isValid()) {
        operator=(inp);
    } else {
        operator=(valueFed->registerInput(key, defaultType, units));
    }
}